

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_object.cpp
# Opt level: O2

void __thiscall
mjs::number_object::do_debug_print_extra
          (number_object *this,wostream *os,int param_2,int param_3,int indent)

{
  wostream *pwVar1;
  char *this_00;
  wstring wStack_58;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::wstring::_M_construct((ulong)local_38,indent);
  pwVar1 = std::operator<<(os,(wstring *)local_38);
  this_00 = "[[Value]]: ";
  pwVar1 = std::operator<<(pwVar1,"[[Value]]: ");
  number_to_string_abi_cxx11_(&wStack_58,(mjs *)this_00,this->value_);
  pwVar1 = std::operator<<(pwVar1,(wstring *)&wStack_58);
  std::operator<<(pwVar1,"\n");
  std::__cxx11::wstring::~wstring((wstring *)&wStack_58);
  std::__cxx11::wstring::~wstring((wstring *)local_38);
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        os << std::wstring(indent, ' ') << "[[Value]]: " << number_to_string(value_) << "\n";
    }